

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkReverseTopoOrderTest(Abc_Ntk_t *p)

{
  Abc_Obj_t *pObj;
  int iVar1;
  Vec_Int_t *vVisited;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  Abc_NtkReverseTopoOrder(p);
  if (p->vTopo != (Vec_Int_t *)0x0) {
    piVar2 = p->vTopo->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vTopo->pArray = (int *)0x0;
    }
    if (p->vTopo != (Vec_Int_t *)0x0) {
      free(p->vTopo);
      p->vTopo = (Vec_Int_t *)0x0;
    }
  }
  iVar6 = 3;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar6,"%s =","Time");
  Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar8 + lVar4) / 1000000.0);
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    local_38 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_38 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  vVisited = (Vec_Int_t *)malloc(0x10);
  vVisited->nCap = 1000;
  vVisited->nSize = 0;
  piVar2 = (int *)malloc(4000);
  vVisited->pArray = piVar2;
  pVVar3 = p->vObjs;
  uVar5 = (ulong)(uint)pVVar3->nSize;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar4];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        vVisited->nSize = 0;
        if ((p->vTravIds).pArray == (int *)0x0) {
          uVar7 = (int)uVar5 + 500;
          if ((p->vTravIds).nCap < (int)uVar7) {
            piVar2 = (int *)malloc((long)(int)uVar7 << 2);
            (p->vTravIds).pArray = piVar2;
            if (piVar2 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            (p->vTravIds).nCap = uVar7;
          }
          if (-500 < (int)uVar5) {
            memset((p->vTravIds).pArray,0,(ulong)uVar7 << 2);
          }
          (p->vTravIds).nSize = uVar7;
        }
        iVar1 = p->nTravIds;
        p->nTravIds = iVar1 + 1;
        if (0x3ffffffe < iVar1) {
          __assert_fail("p->nTravIds < (1<<30)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                        ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
        }
        Abc_NtkReverse_rec(pObj,vVisited);
      }
      lVar4 = lVar4 + 1;
      pVVar3 = p->vObjs;
      uVar5 = (ulong)pVVar3->nSize;
    } while (lVar4 < (long)uVar5);
  }
  if (vVisited->pArray != (int *)0x0) {
    free(vVisited->pArray);
    vVisited->pArray = (int *)0x0;
  }
  free(vVisited);
  iVar6 = 3;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  lVar4 = lVar4 + local_38;
  Abc_Print(iVar6,"%s =","Time");
  Abc_Print(iVar6,"%9.2f sec\n",(double)lVar4 / 1000000.0);
  return;
}

Assistant:

void Abc_NtkReverseTopoOrderTest( Abc_Ntk_t * p )
{
    Vec_Int_t * vVisited;
    Abc_Obj_t * pObj;
    int i;//, k, iBeg, iEnd;
    abctime clk = Abc_Clock();
    Abc_NtkReverseTopoOrder( p );
/*
    printf( "Reverse topological order for nodes:\n" );
    Abc_NtkForEachNode( p, pObj, i )
    {
        iBeg = Abc_NtkTopoHasBeg( pObj );
        iEnd = Abc_NtkTopoHasEnd( pObj );
        printf( "Node %4d : ", Abc_ObjId(pObj) );
        for ( k = iEnd - 1; k >= iBeg; k-- )
            printf( "%d ", Vec_IntEntry(p->vTopo, k) );
        printf( "\n" );
    }
*/
    Vec_IntFreeP( &p->vTopo );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // compute regular fanout orders
    clk = Abc_Clock();
    vVisited = Vec_IntAlloc( 1000 );
    Abc_NtkForEachNode( p, pObj, i )
    {
        Vec_IntClear( vVisited );
        Abc_NtkIncrementTravId( p ); 
        Abc_NtkReverse_rec( pObj, vVisited );
    }
    Vec_IntFree( vVisited );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}